

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O2

void __thiscall
sparse_square_matrix<bool>::set(sparse_square_matrix<bool> *this,uint32_t i,uint32_t j,bool *value)

{
  mapped_type mVar1;
  uint uVar2;
  mapped_type *pmVar3;
  ulong *puVar4;
  char *__assertion;
  reference rVar5;
  ulong local_18;
  
  uVar2 = this->N;
  if (i < uVar2) {
    if (j < uVar2) {
      mVar1 = *value;
      if (((this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p ==
           (this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
         ((this->denseStorage).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0)) {
        local_18 = (ulong)(uVar2 * i + j);
        pmVar3 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_bool>,_std::allocator<std::pair<const_unsigned_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_bool>,_std::allocator<std::pair<const_unsigned_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->sparseStorage,&local_18);
        *pmVar3 = mVar1;
      }
      else {
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->denseStorage,(ulong)(uVar2 * i + j));
        puVar4 = rVar5._M_p;
        if (mVar1 == false) {
          *puVar4 = *puVar4 & ~rVar5._M_mask;
        }
        else {
          *puVar4 = *puVar4 | rVar5._M_mask;
        }
      }
      return;
    }
    __assertion = "j < N";
    uVar2 = 0x30;
  }
  else {
    __assertion = "i < N";
    uVar2 = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                ,uVar2,
                "void sparse_square_matrix<bool>::set(uint32_t, uint32_t, const Ty &) [Ty = bool]");
}

Assistant:

void set(uint32_t i, uint32_t j, const Ty& value) {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      denseStorage[i * N + j] = value;
    } else {
      sparseStorage[i * N + j] = value;
    }
  }